

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O3

Id dxil_spv::emit_native_bitscan(GLSLstd450 opcode,Impl *impl,Instruction *instruction,Value *value)

{
  Id IVar1;
  uint uVar2;
  Id component;
  Id IVar3;
  Id IVar4;
  Builder *this;
  Type *pTVar5;
  Operation *pOVar6;
  Operation *pOVar7;
  Operation *this_00;
  Id elems [2];
  Id local_38;
  Id local_34;
  
  this = Converter::Impl::builder(impl);
  if (impl->glsl_std450_ext == 0) {
    IVar1 = spv::Builder::import(this,"GLSL.std.450");
    impl->glsl_std450_ext = IVar1;
  }
  pTVar5 = LLVMBC::Value::getType(value);
  uVar2 = LLVMBC::Type::getIntegerBitWidth(pTVar5);
  if (uVar2 == 0x10) {
    IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
    pOVar6 = Converter::Impl::allocate(impl,(opcode == GLSLstd450FindSMsb) + OpUConvert,IVar1);
    IVar1 = Converter::Impl::get_id_for_value(impl,value,0);
    Operation::add_id(pOVar6,IVar1);
    Converter::Impl::add(impl,pOVar6,false);
    if (instruction == (Instruction *)0x0) {
      IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
      pOVar7 = Converter::Impl::allocate(impl,OpExtInst,IVar1);
    }
    else {
      pOVar7 = Converter::Impl::allocate(impl,OpExtInst,&instruction->super_Value);
    }
    Operation::add_id(pOVar7,impl->glsl_std450_ext);
    Operation::add_literal(pOVar7,opcode);
    IVar1 = pOVar6->id;
  }
  else {
    pTVar5 = LLVMBC::Value::getType(value);
    uVar2 = LLVMBC::Type::getIntegerBitWidth(pTVar5);
    if (uVar2 == 0x40) {
      component = spv::Builder::makeIntegerType(this,0x20,false);
      IVar1 = spv::Builder::makeVectorType(this,component,2);
      pOVar6 = Converter::Impl::allocate(impl,OpBitcast,IVar1);
      IVar3 = Converter::Impl::get_id_for_value(impl,value,0);
      Operation::add_id(pOVar6,IVar3);
      Converter::Impl::add(impl,pOVar6,false);
      pOVar7 = pOVar6;
      if (opcode == GLSLstd450FindSMsb) {
        pOVar7 = Converter::Impl::allocate(impl,OpCompositeExtract,component);
        Operation::add_id(pOVar7,pOVar6->id);
        Operation::add_literal(pOVar7,1);
        Converter::Impl::add(impl,pOVar7,false);
        IVar3 = spv::Builder::makeIntegerType(this,0x20,true);
        this_00 = Converter::Impl::allocate(impl,OpShiftRightArithmetic,IVar3);
        Operation::add_id(this_00,pOVar7->id);
        IVar4 = spv::Builder::makeIntegerType(this,0x20,true);
        IVar4 = spv::Builder::makeIntConstant(this,IVar4,0x1f,false);
        Operation::add_id(this_00,IVar4);
        Converter::Impl::add(impl,this_00,false);
        local_38 = this_00->id;
        local_34 = local_38;
        pOVar7 = Converter::Impl::allocate(impl,OpBitwiseXor,IVar1);
        Operation::add_id(pOVar7,pOVar6->id);
        IVar3 = Converter::Impl::build_vector(impl,IVar3,&local_38,2);
        Operation::add_id(pOVar7,IVar3);
        Converter::Impl::add(impl,pOVar7,false);
        opcode = GLSLstd450FindUMsb;
      }
      pOVar6 = Converter::Impl::allocate(impl,OpExtInst,IVar1);
      Operation::add_id(pOVar6,impl->glsl_std450_ext);
      Operation::add_literal(pOVar6,opcode);
      Operation::add_id(pOVar6,pOVar7->id);
      Converter::Impl::add(impl,pOVar6,false);
      pOVar7 = Converter::Impl::allocate(impl,OpCompositeExtract,component);
      Operation::add_id(pOVar7,pOVar6->id);
      Operation::add_literal(pOVar7,0);
      Converter::Impl::add(impl,pOVar7,false);
      IVar3 = pOVar7->id;
      pOVar7 = Converter::Impl::allocate(impl,OpCompositeExtract,component);
      Operation::add_id(pOVar7,pOVar6->id);
      Operation::add_literal(pOVar7,1);
      Converter::Impl::add(impl,pOVar7,false);
      IVar1 = pOVar7->id;
      pOVar7 = Converter::Impl::allocate(impl,OpBitwiseOr,component);
      Operation::add_id(pOVar7,IVar1);
      IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar1 = spv::Builder::makeIntConstant(this,IVar1,0x20,false);
      Operation::add_id(pOVar7,IVar1);
      Converter::Impl::add(impl,pOVar7,false);
      IVar1 = pOVar7->id;
      if (instruction == (Instruction *)0x0) {
        pOVar7 = Converter::Impl::allocate(impl,OpExtInst,component);
      }
      else {
        pOVar7 = Converter::Impl::allocate(impl,OpExtInst,&instruction->super_Value);
      }
      Operation::add_id(pOVar7,impl->glsl_std450_ext);
      Operation::add_literal(pOVar7,(uint)(opcode != GLSLstd450FindILsb) * 4 + 0x26);
      Operation::add_id(pOVar7,IVar3);
    }
    else {
      if (instruction == (Instruction *)0x0) {
        IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
        pOVar7 = Converter::Impl::allocate(impl,OpExtInst,IVar1);
      }
      else {
        pOVar7 = Converter::Impl::allocate(impl,OpExtInst,&instruction->super_Value);
      }
      Operation::add_id(pOVar7,impl->glsl_std450_ext);
      Operation::add_literal(pOVar7,opcode);
      IVar1 = Converter::Impl::get_id_for_value(impl,value,0);
    }
  }
  Operation::add_id(pOVar7,IVar1);
  Converter::Impl::add(impl,pOVar7,false);
  return pOVar7->id;
}

Assistant:

spv::Id emit_native_bitscan(GLSLstd450 opcode, Converter::Impl &impl,
                            const llvm::Instruction *instruction, const llvm::Value *value)
{
	auto &builder = impl.builder();
	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	Operation *op;

	// Vulkan currently does not allow 16/64-bit for these ... :(
	if (value->getType()->getIntegerBitWidth() == 16)
	{
		auto *extend = impl.allocate(
		    opcode == GLSLstd450FindSMsb ? spv::OpSConvert : spv::OpUConvert, builder.makeUintType(32));

		extend->add_id(impl.get_id_for_value(value));
		impl.add(extend);

		if (instruction)
			op = impl.allocate(spv::OpExtInst, instruction);
		else
			op = impl.allocate(spv::OpExtInst, builder.makeUintType(32));

		op->add_id(impl.glsl_std450_ext);
		op->add_literal(opcode);
		op->add_id(extend->id);
	}
	else if (value->getType()->getIntegerBitWidth() == 64)
	{
		spv::Id uint_type = builder.makeUintType(32);
		spv::Id uvec2_type = builder.makeVectorType(uint_type, 2);

		auto *bitcast = impl.allocate(spv::OpBitcast, uvec2_type);
		bitcast->add_id(impl.get_id_for_value(value));
		impl.add(bitcast);

		if (opcode == GLSLstd450FindSMsb)
		{
			auto *ext = impl.allocate(spv::OpCompositeExtract, uint_type);
			ext->add_id(bitcast->id);
			ext->add_literal(1);
			impl.add(ext);

			spv::Id int_type = builder.makeIntType(32);
			auto *shifted = impl.allocate(spv::OpShiftRightArithmetic, int_type);
			shifted->add_id(ext->id);
			shifted->add_id(builder.makeIntConstant(31));
			impl.add(shifted);

			const spv::Id elems[] = { shifted->id, shifted->id };

			auto *xored = impl.allocate(spv::OpBitwiseXor, uvec2_type);
			xored->add_id(bitcast->id);
			xored->add_id(impl.build_vector(int_type, elems, 2));
			impl.add(xored);

			bitcast = xored;
			opcode = GLSLstd450FindUMsb;
		}

		auto *ilsb = impl.allocate(spv::OpExtInst, uvec2_type);
		ilsb->add_id(impl.glsl_std450_ext);
		ilsb->add_literal(opcode);
		ilsb->add_id(bitcast->id);
		impl.add(ilsb);

		spv::Id scalars[2];
		for (int i = 0; i < 2; i++)
		{
			auto *ext = impl.allocate(spv::OpCompositeExtract, uint_type);
			ext->add_id(ilsb->id);
			ext->add_literal(i);
			impl.add(ext);
			scalars[i] = ext->id;
		}

		auto *or32 = impl.allocate(spv::OpBitwiseOr, uint_type);
		or32->add_id(scalars[1]);
		or32->add_id(builder.makeUintConstant(32));
		impl.add(or32);
		scalars[1] = or32->id;

		auto merge_op = opcode == GLSLstd450FindILsb ? GLSLstd450UMin : GLSLstd450SMax;

		if (instruction)
			op = impl.allocate(spv::OpExtInst, instruction);
		else
			op = impl.allocate(spv::OpExtInst, uint_type);

		op->add_id(impl.glsl_std450_ext);
		op->add_literal(merge_op);
		op->add_id(scalars[0]);
		op->add_id(scalars[1]);
	}
	else
	{
		if (instruction)
			op = impl.allocate(spv::OpExtInst, instruction);
		else
			op = impl.allocate(spv::OpExtInst, builder.makeUintType(32));

		op->add_id(impl.glsl_std450_ext);
		op->add_literal(opcode);
		op->add_id(impl.get_id_for_value(value));
	}

	impl.add(op);
	return op->id;
}